

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerTest *this)

{
  pointer pVVar1;
  uint uVar2;
  Vector<float,_4> local_28;
  
  createTestQuadMosaic(__return_storage_ptr__,this->m_imageViewType);
  uVar2 = 0;
  while( true ) {
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(__return_storage_ptr__->
                      super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5) <=
        (ulong)uVar2) break;
    local_28.m_data[0] = 0.002;
    local_28.m_data[1] = 0.002;
    local_28.m_data[2] = 0.002;
    local_28.m_data[3] = 0.0;
    tcu::Vector<float,_4>::operator+=(&pVVar1[uVar2].texCoord,&local_28);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = createTestQuadMosaic(m_imageViewType);
	// Adjust texture coordinate to avoid doing NEAREST filtering exactly on texel boundaries.
	// TODO: Would be nice to base this on number of texels and subtexel precision. But this
	// seems to work.
	for (unsigned int i = 0; i < vertices.size(); ++i) {
		vertices[i].texCoord += tcu::Vec4(0.002f, 0.002f, 0.002f, 0.0f);
	}
	return vertices;
}